

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O3

bool __thiscall AllDiffDomain<0>::tarjan(AllDiffDomain<0> *this,int node)

{
  Node *pNVar1;
  bool *pbVar2;
  uint uVar3;
  uint uVar4;
  IntVar *pIVar5;
  bool bVar6;
  Tchar *pTVar7;
  Node *pNVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  
  pNVar8 = this->var_nodes;
  pNVar8[node].mark = true;
  iVar11 = this->index;
  this->index = iVar11 + 1;
  pNVar8[node].index = iVar11;
  pNVar8[node].next = this->stack;
  this->stack = node;
  pNVar8[node].scc = -1;
  pNVar8[node].leak = false;
  if (node < this->sz) {
    pIVar5 = this->x[node].var;
    iVar11 = (pIVar5->min).v;
    do {
      if (iVar11 == (pIVar5->max).v) {
        iVar12 = -0x80000000;
      }
      else {
        pTVar7 = pIVar5->vals + iVar11;
        iVar12 = iVar11;
        do {
          pTVar7 = pTVar7 + 1;
          iVar12 = iVar12 + 1;
        } while (pTVar7->v == '\0');
      }
      pNVar8 = this->val_nodes;
      if (pNVar8[iVar11].mark == false) {
        bVar6 = tarjan(this,this->sz + iVar11);
        if (!bVar6) {
          return false;
        }
        pNVar8 = this->val_nodes;
      }
      if (pNVar8[iVar11].scc < 0) {
        iVar9 = this->var_nodes[node].index;
        if (pNVar8[iVar11].index < iVar9) {
          iVar9 = pNVar8[iVar11].index;
        }
        this->var_nodes[node].index = iVar9;
      }
      else if (pNVar8[iVar11].leak == false) {
        bVar6 = prune(this,node,iVar11);
        if (!bVar6) {
          return false;
        }
        pNVar8 = this->val_nodes;
      }
      pbVar2 = &this->var_nodes[node].leak;
      *pbVar2 = (bool)(*pbVar2 | pNVar8[iVar11].leak);
      iVar11 = iVar12;
    } while( true );
  }
  iVar12 = pNVar8[node].match.v;
  lVar10 = (long)iVar12;
  if (lVar10 < 0) {
    pNVar8[node].leak = true;
  }
  else {
    if (pNVar8[lVar10].mark == false) {
      bVar6 = tarjan(this,iVar12);
      if (!bVar6) {
        return false;
      }
      pNVar8 = this->var_nodes;
    }
    if (pNVar8[lVar10].scc < 0) {
      iVar12 = pNVar8[node].index;
      if (pNVar8[lVar10].index < pNVar8[node].index) {
        iVar12 = pNVar8[lVar10].index;
      }
      pNVar8[node].index = iVar12;
    }
    pNVar8[node].leak = (bool)(pNVar8[node].leak | pNVar8[lVar10].leak);
  }
  if (iVar11 <= pNVar8[node].index) {
    pNVar1 = pNVar8 + node;
    bVar6 = pNVar1->leak;
    uVar3 = this->stack;
    this->stack = pNVar1->next;
    pNVar1->next = -1;
    for (uVar4 = uVar3; -1 < (int)uVar4; uVar4 = pNVar8[uVar4].next) {
      pNVar8[uVar4].leak = bVar6;
      pNVar8[uVar4].scc = uVar3;
    }
  }
  return true;
}

Assistant:

bool tarjan(int node) {
		var_nodes[node].mark = true;

		const int index_save = index++;
		var_nodes[node].index = index_save;

		var_nodes[node].next = stack;
		stack = node;
		var_nodes[node].scc = -1;  // means stacked

		var_nodes[node].leak = false;
		if (node < sz) {
			// visiting var node
			for (typename IntView<U>::iterator i = x[node].begin(); i != x[node].end();) {
				const int val = *i++;
				if (!val_nodes[val].mark && !tarjan(sz + val)) {
					return false;
				}
				if (val_nodes[val].scc < 0) {
					var_nodes[node].index = std::min(var_nodes[node].index, val_nodes[val].index);
				} else if (!val_nodes[val].leak && !prune(node, val)) {
					return false;
				}
				var_nodes[node].leak |= val_nodes[val].leak;
			}
		} else {
			// visiting val node
			const int var = var_nodes[node].match;
			if (var < 0) {
				var_nodes[node].leak = true;  // unassigned value
			} else {
				if (!var_nodes[var].mark && !tarjan(var)) {
					return false;
				}
				if (var_nodes[var].scc < 0) {
					var_nodes[node].index = std::min(var_nodes[node].index, var_nodes[var].index);
				}
				var_nodes[node].leak |= var_nodes[var].leak;
			}
		}

		if (var_nodes[node].index >= index_save) {  // node is SCC-root
			const int leak = static_cast<int>(var_nodes[node].leak);
			const int scc = stack;
			stack = var_nodes[node].next;
			var_nodes[node].next = -1;

			// fprintf(stderr, "leak %d\n", leak);
			for (int i = scc; i >= 0; i = var_nodes[i].next) {
				assert(var_nodes[i].mark);
				var_nodes[i].leak = (leak != 0);  // propagate through SCC
				var_nodes[i].scc = scc;           // propagate through SCC
																					// if (i < sz)
																					//  fprintf(stderr, "  var %d\n", i);
																					// else
																					//  fprintf(stderr, "  val %d\n", i - sz);
			}
		}
		return true;
	}